

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void err_print(Err *err,_Bool use_color)

{
  _Bool use_color_local;
  Err *err_local;
  
  if (err != (Err *)0x0) {
    if (use_color) {
      err_print_color(err);
    }
    else {
      err_print_bw(err);
    }
  }
  return;
}

Assistant:

void err_print(Err *err, bool use_color) {
	if (err == NULL) {
		return;
	}
	if (use_color) {
		err_print_color(err);
	} else {
		err_print_bw(err);
	}
}